

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O3

void __thiscall cppcms::widgets::password::validate(password *this)

{
  validate((password *)
           ((long)&(this->super_text).super_base_html_input._vptr_base_html_input +
           (long)(this->super_text).super_base_html_input._vptr_base_html_input[-5]));
  return;
}

Assistant:

bool password::validate()
{
	if(!text::validate()) {
		value("");
		return false;
	}
	if(password_to_check_) {
		if(!password_to_check_->set() || !set() || password_to_check_->value()!=value()) {
			valid(false);
			value("");
			password_to_check_->value("");
			return false;
		}
	}
	return true;

}